

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getKeywordType(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 == 0x77) {
    return CHandleType;
  }
  if (iVar1 == 0xa2) {
    return EventType;
  }
  if (iVar1 == 0x146) {
    return VoidType;
  }
  if (iVar1 != 0xff) {
    if (iVar1 == 0x114) {
      return ShortRealType;
    }
    if (iVar1 != 0x11d) {
      if (iVar1 == 0xfe) {
        return RealType;
      }
      return Unknown;
    }
    return StringType;
  }
  return RealTimeType;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordType(TokenKind kind) {
    switch (kind) {
        case TokenKind::ShortRealKeyword: return SyntaxKind::ShortRealType;
        case TokenKind::RealKeyword: return SyntaxKind::RealType;
        case TokenKind::RealTimeKeyword: return SyntaxKind::RealTimeType;
        case TokenKind::StringKeyword: return SyntaxKind::StringType;
        case TokenKind::CHandleKeyword: return SyntaxKind::CHandleType;
        case TokenKind::EventKeyword: return SyntaxKind::EventType;
        case TokenKind::VoidKeyword: return SyntaxKind::VoidType;
        default: return SyntaxKind::Unknown;
    }
}